

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::TypedFloatConstantGenerator::MakeInf
          (string *__return_storage_ptr__,TypedFloatConstantGenerator *this,bool neg,string *prefix)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if ((int)CONCAT71(in_register_00000011,neg) == 0) {
    __rhs = &this->pos_inf_number_;
  }
  else {
    if ((this->neg_inf_number_)._M_string_length == 0) {
      std::operator+(&bStack_38,"-",prefix);
      std::operator+(__return_storage_ptr__,&bStack_38,&this->pos_inf_number_);
      std::__cxx11::string::~string((string *)&bStack_38);
      return __return_storage_ptr__;
    }
    __rhs = &this->neg_inf_number_;
  }
  std::operator+(__return_storage_ptr__,prefix,__rhs);
  return __return_storage_ptr__;
}

Assistant:

std::string TypedFloatConstantGenerator::MakeInf(
    bool neg, const std::string &prefix) const {
  if (neg)
    return !neg_inf_number_.empty() ? (prefix + neg_inf_number_)
                                    : ("-" + prefix + pos_inf_number_);
  else
    return prefix + pos_inf_number_;
}